

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.c
# Opt level: O1

void set_socket_both_buffer_sizes(int socket_fd)

{
  set_socket_buffer_size(socket_fd,SEND);
  set_socket_buffer_size(socket_fd,RECEIVE);
  return;
}

Assistant:

void set_socket_both_buffer_sizes(int socket_fd) {
	// clang-format off
	set_socket_buffer_size(
		socket_fd,
		SEND
	 );

	set_socket_buffer_size(
		socket_fd,
		RECEIVE
	 );
	// clang-format on
}